

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int split_left(saucy *s,coloring *c,int cf,int ff)

{
  s->splitwho[s->nsplits] = ff;
  s->splitfrom[s->nsplits] = cf;
  s->nsplits = s->nsplits + 1;
  split_common(s,c,cf,ff);
  return 1;
}

Assistant:

static int
split_left(struct saucy *s, struct coloring *c, int cf, int ff)
{
    /* Record the split */
    s->splitwho[s->nsplits] = ff;
    s->splitfrom[s->nsplits] = cf;
    ++s->nsplits;

    /* Do common splitting tasks */
    split_common(s, c, cf, ff);

    /* Always succeeds */
    return 1;
}